

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

with_default_ctor *
pstore::sparse_array<(anonymous_namespace)::with_default_ctor,pstore::uint128>::
index_impl<pstore::sparse_array<(anonymous_namespace)::with_default_ctor,pstore::uint128>&,(anonymous_namespace)::with_default_ctor>
          (sparse_array<(anonymous_namespace)::with_default_ctor,_pstore::uint128> *sa,size_type pos
          )

{
  uint128 rhs;
  uint128 rhs_00;
  uint128 x;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  bit_count *this;
  int extraout_EDX;
  unsigned_long n;
  undefined8 in_stack_ffffffffffffff68;
  with_default_ctor *pwVar4;
  uint128 *local_48 [2];
  uint128 local_38;
  uint128 *local_28;
  uint128 mask;
  size_type pos_local;
  sparse_array<(anonymous_namespace)::with_default_ctor,_pstore::uint128> *sa_local;
  
  mask.v_._8_8_ = (uint128 *)pos;
  sVar3 = sparse_array<(anonymous_namespace)::with_default_ctor,_pstore::uint128>::max_size();
  if (sVar3 <= pos) {
    assert_failed("pos < max_size ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                  ,0x268);
  }
  uint128::uint128<unsigned_int,void>(&local_38,1);
  local_28 = uint128::operator<<(&local_38,mask.v_._8_8_,n);
  rhs.v_._8_8_ = pos;
  rhs.v_._0_8_ = in_stack_ffffffffffffff68;
  local_48[0] = uint128::operator&(&sa->bitmap_,local_28,rhs);
  bVar1 = uint128::operator!=((uint128 *)local_48,0);
  if (!bVar1) {
    assert_failed("(sa.bitmap_ & mask) != 0U",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                  ,0x26a);
  }
  uint128::operator--((uint128 *)&local_28,(uint128 *)0x0,extraout_EDX);
  pwVar4 = sa->elements_;
  rhs_00.v_._8_8_ = pos;
  rhs_00.v_._0_8_ = pwVar4;
  this = (bit_count *)uint128::operator&(&sa->bitmap_,local_28,rhs_00);
  x.v_._8_8_ = pos;
  x.v_._0_8_ = pwVar4;
  uVar2 = bit_count::pop_count(this,x);
  return pwVar4 + uVar2;
}

Assistant:

ResultType & sparse_array<ValueType, BitmapType>::index_impl (SparseArray && sa,
                                                                  size_type pos) noexcept {
        PSTORE_ASSERT (pos < max_size ());
        auto mask = BitmapType{1U} << pos;
        PSTORE_ASSERT ((sa.bitmap_ & mask) != 0U);
        mask--;
        return sa.elements_[bit_count::pop_count (static_cast<BitmapType> (sa.bitmap_ & mask))];
    }